

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode verifystatus(connectdata *conn,ssl_connect_data *connssl)

{
  OCSP_RESPONSE *pOVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ASN1_GENERALIZEDTIME *local_88;
  ASN1_GENERALIZEDTIME *nextupd;
  ASN1_GENERALIZEDTIME *thisupd;
  ASN1_GENERALIZEDTIME *rev;
  OCSP_SINGLERESP *single;
  int crl_reason;
  int cert_status;
  long len;
  stack_st_X509 *ch;
  X509_STORE *st;
  OCSP_BASICRESP *br;
  OCSP_RESPONSE *rsp;
  Curl_easy *data;
  uchar *puStack_28;
  CURLcode result;
  uchar *p;
  int ocsp_status;
  int i;
  ssl_connect_data *connssl_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  rsp = (OCSP_RESPONSE *)conn->data;
  br = (OCSP_BASICRESP *)0x0;
  st = (X509_STORE *)0x0;
  ch = (stack_st_X509 *)0x0;
  len = 0;
  _ocsp_status = connssl;
  connssl_local = (ssl_connect_data *)conn;
  _crl_reason = SSL_ctrl((SSL *)connssl->handle,0x46,0,&stack0xffffffffffffffd8);
  if (puStack_28 == (uchar *)0x0) {
    Curl_failf((Curl_easy *)rsp,"No OCSP response received");
    data._4_4_ = CURLE_SSL_INVALIDCERTSTATUS;
  }
  else {
    br = (OCSP_BASICRESP *)
         d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,&stack0xffffffffffffffd8,_crl_reason);
    if ((OCSP_RESPONSE *)br == (OCSP_RESPONSE *)0x0) {
      Curl_failf((Curl_easy *)rsp,"Invalid OCSP response");
      data._4_4_ = CURLE_SSL_INVALIDCERTSTATUS;
    }
    else {
      p._0_4_ = OCSP_response_status((OCSP_RESPONSE *)br);
      pOVar1 = rsp;
      if ((uint)p == 0) {
        st = (X509_STORE *)OCSP_response_get1_basic((OCSP_RESPONSE *)br);
        if ((OCSP_BASICRESP *)st == (OCSP_BASICRESP *)0x0) {
          Curl_failf((Curl_easy *)rsp,"Invalid OCSP response");
          data._4_4_ = CURLE_SSL_INVALIDCERTSTATUS;
        }
        else {
          len = (long)SSL_get_peer_cert_chain((SSL *)_ocsp_status->handle);
          ch = (stack_st_X509 *)SSL_CTX_get_cert_store((SSL_CTX *)_ocsp_status->ctx);
          iVar2 = OCSP_basic_verify((OCSP_BASICRESP *)st,(stack_st_X509 *)len,(X509_STORE *)ch,0);
          if (iVar2 < 1) {
            Curl_failf((Curl_easy *)rsp,"OCSP response verification failed");
            data._4_4_ = CURLE_SSL_INVALIDCERTSTATUS;
          }
          else {
            for (p._4_4_ = 0; iVar2 = p._4_4_, iVar3 = OCSP_resp_count((OCSP_BASICRESP *)st),
                iVar2 < iVar3; p._4_4_ = p._4_4_ + 1) {
              rev = (ASN1_GENERALIZEDTIME *)0x0;
              rev = (ASN1_GENERALIZEDTIME *)OCSP_resp_get0((OCSP_BASICRESP *)st,p._4_4_);
              if ((OCSP_SINGLERESP *)rev != (OCSP_SINGLERESP *)0x0) {
                single._4_4_ = OCSP_single_get0_status
                                         ((OCSP_SINGLERESP *)rev,(int *)&single,
                                          (ASN1_GENERALIZEDTIME **)&thisupd,
                                          (ASN1_GENERALIZEDTIME **)&nextupd,&local_88);
                iVar2 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)nextupd,local_88,300,-1);
                pOVar1 = rsp;
                if (iVar2 == 0) {
                  Curl_failf((Curl_easy *)rsp,"OCSP response has expired");
                  data._4_4_ = CURLE_SSL_INVALIDCERTSTATUS;
                  break;
                }
                pcVar4 = OCSP_cert_status_str((long)(int)single._4_4_);
                Curl_infof((Curl_easy *)pOVar1,"SSL certificate status: %s (%d)\n",pcVar4,
                           (ulong)single._4_4_);
                pOVar1 = rsp;
                if (single._4_4_ != 0) {
                  if (single._4_4_ == 1) {
                    data._4_4_ = CURLE_SSL_INVALIDCERTSTATUS;
                    pcVar4 = OCSP_crl_reason_str((long)(int)(uint)single);
                    Curl_failf((Curl_easy *)pOVar1,"SSL certificate revocation reason: %s (%d)",
                               pcVar4,(ulong)(uint)single);
                    break;
                  }
                  if (single._4_4_ == 2) {
                    data._4_4_ = CURLE_SSL_INVALIDCERTSTATUS;
                    break;
                  }
                }
              }
            }
          }
        }
      }
      else {
        pcVar4 = OCSP_response_status_str((long)(int)(uint)p);
        Curl_failf((Curl_easy *)pOVar1,"Invalid OCSP response status: %s (%d)",pcVar4,(ulong)(uint)p
                  );
        data._4_4_ = CURLE_SSL_INVALIDCERTSTATUS;
      }
    }
  }
  if (st != (X509_STORE *)0x0) {
    OCSP_BASICRESP_free((OCSP_BASICRESP *)st);
  }
  OCSP_RESPONSE_free((OCSP_RESPONSE *)br);
  return data._4_4_;
}

Assistant:

static CURLcode verifystatus(struct connectdata *conn,
                             struct ssl_connect_data *connssl)
{
  int i, ocsp_status;
  const unsigned char *p;
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  OCSP_RESPONSE *rsp = NULL;
  OCSP_BASICRESP *br = NULL;
  X509_STORE     *st = NULL;
  STACK_OF(X509) *ch = NULL;

  long len = SSL_get_tlsext_status_ocsp_resp(connssl->handle, &p);

  if(!p) {
    failf(data, "No OCSP response received");
    result = CURLE_SSL_INVALIDCERTSTATUS;
    goto end;
  }

  rsp = d2i_OCSP_RESPONSE(NULL, &p, len);
  if(!rsp) {
    failf(data, "Invalid OCSP response");
    result = CURLE_SSL_INVALIDCERTSTATUS;
    goto end;
  }

  ocsp_status = OCSP_response_status(rsp);
  if(ocsp_status != OCSP_RESPONSE_STATUS_SUCCESSFUL) {
    failf(data, "Invalid OCSP response status: %s (%d)",
          OCSP_response_status_str(ocsp_status), ocsp_status);
    result = CURLE_SSL_INVALIDCERTSTATUS;
    goto end;
  }

  br = OCSP_response_get1_basic(rsp);
  if(!br) {
    failf(data, "Invalid OCSP response");
    result = CURLE_SSL_INVALIDCERTSTATUS;
    goto end;
  }

  ch = SSL_get_peer_cert_chain(connssl->handle);
  st = SSL_CTX_get_cert_store(connssl->ctx);

#if ((OPENSSL_VERSION_NUMBER <= 0x1000201fL) /* Fixed after 1.0.2a */ || \
     (defined(LIBRESSL_VERSION_NUMBER) &&                               \
      LIBRESSL_VERSION_NUMBER <= 0x2040200fL))
  /* The authorized responder cert in the OCSP response MUST be signed by the
     peer cert's issuer (see RFC6960 section 4.2.2.2). If that's a root cert,
     no problem, but if it's an intermediate cert OpenSSL has a bug where it
     expects this issuer to be present in the chain embedded in the OCSP
     response. So we add it if necessary. */

  /* First make sure the peer cert chain includes both a peer and an issuer,
     and the OCSP response contains a responder cert. */
  if(sk_X509_num(ch) >= 2 && sk_X509_num(br->certs) >= 1) {
    X509 *responder = sk_X509_value(br->certs, sk_X509_num(br->certs) - 1);

    /* Find issuer of responder cert and add it to the OCSP response chain */
    for(i = 0; i < sk_X509_num(ch); i++) {
      X509 *issuer = sk_X509_value(ch, i);
      if(X509_check_issued(issuer, responder) == X509_V_OK) {
        if(!OCSP_basic_add1_cert(br, issuer)) {
          failf(data, "Could not add issuer cert to OCSP response");
          result = CURLE_SSL_INVALIDCERTSTATUS;
          goto end;
        }
      }
    }
  }
#endif

  if(OCSP_basic_verify(br, ch, st, 0) <= 0) {
    failf(data, "OCSP response verification failed");
    result = CURLE_SSL_INVALIDCERTSTATUS;
    goto end;
  }

  for(i = 0; i < OCSP_resp_count(br); i++) {
    int cert_status, crl_reason;
    OCSP_SINGLERESP *single = NULL;

    ASN1_GENERALIZEDTIME *rev, *thisupd, *nextupd;

    single = OCSP_resp_get0(br, i);
    if(!single)
      continue;

    cert_status = OCSP_single_get0_status(single, &crl_reason, &rev,
                                          &thisupd, &nextupd);

    if(!OCSP_check_validity(thisupd, nextupd, 300L, -1L)) {
      failf(data, "OCSP response has expired");
      result = CURLE_SSL_INVALIDCERTSTATUS;
      goto end;
    }

    infof(data, "SSL certificate status: %s (%d)\n",
          OCSP_cert_status_str(cert_status), cert_status);

    switch(cert_status) {
      case V_OCSP_CERTSTATUS_GOOD:
        break;

      case V_OCSP_CERTSTATUS_REVOKED:
        result = CURLE_SSL_INVALIDCERTSTATUS;

        failf(data, "SSL certificate revocation reason: %s (%d)",
              OCSP_crl_reason_str(crl_reason), crl_reason);
        goto end;

      case V_OCSP_CERTSTATUS_UNKNOWN:
        result = CURLE_SSL_INVALIDCERTSTATUS;
        goto end;
    }
  }

end:
  if(br) OCSP_BASICRESP_free(br);
  OCSP_RESPONSE_free(rsp);

  return result;
}